

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Backlog.cpp
# Opt level: O1

void __thiscall Backlog::remove_task(Backlog *this,shared_ptr<Task> *tsk)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<Task> *psVar2;
  shared_ptr<Task> *__result;
  
  __result = (this->TaskuriNeplanificate).
             super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->TaskuriNeplanificate).
           super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__result != psVar2) {
    do {
      if ((tsk->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
          (__result->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
        psVar2 = (this->TaskuriNeplanificate).
                 super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (__result + 1 != psVar2) {
          std::__copy_move<true,false,std::random_access_iterator_tag>::
          __copy_m<std::shared_ptr<Task>*,std::shared_ptr<Task>*>(__result + 1,psVar2,__result);
        }
        psVar1 = (this->TaskuriNeplanificate).
                 super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        (this->TaskuriNeplanificate).
        super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>._M_impl.
        super__Vector_impl_data._M_finish = psVar1 + -1;
        this_00 = psVar1[-1].super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        return;
      }
      __result = __result + 1;
    } while (__result != psVar2);
  }
  return;
}

Assistant:

void Backlog::remove_task(const std::shared_ptr<Task> &tsk) {
    for(auto i=TaskuriNeplanificate.begin(); i != TaskuriNeplanificate.end(); ++i)
        if(operator==(tsk, *i))
        {
            TaskuriNeplanificate.erase(i);
            break;
        }
}